

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
::destroy_slots(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                *this)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  uint32_t uVar3;
  undefined1 (*pauVar4) [16];
  ushort x;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  GroupPortableImpl local_38;
  
  lVar7 = *(long *)((long)&(this->settings_).
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_ + 8);
  uVar5 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  pauVar2 = (undefined1 (*) [16])
            (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.control;
  if (uVar5 < 0xf) {
    if (8 < uVar5) {
      __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x78b,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                   );
    }
    local_38.ctrl = *(uint64_t *)(*pauVar2 + uVar5);
    local_38.ctrl = (uint64_t)GroupPortableImpl::MaskFull(&local_38);
    for (; local_38.ctrl != 0; local_38.ctrl = local_38.ctrl - 1 & local_38.ctrl) {
      uVar3 = NonIterableBitMask<unsigned_long,_8,_3>::LowestBitSet
                        ((NonIterableBitMask<unsigned_long,_8,_3> *)&local_38);
      destroy(this,(slot_type *)((ulong)uVar3 * 0x28 + lVar7 + -0x28));
    }
  }
  else {
    uVar6 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_ >> 1;
    uVar5 = uVar6;
    while (pauVar4 = pauVar2, uVar5 != 0) {
      auVar1 = *pauVar4;
      for (x = ~((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf); x != 0; x = x - 1 & x) {
        uVar3 = TrailingZeros<unsigned_short>(x);
        if ((char)(*pauVar4)[uVar3] < '\0') {
          __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x79d,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                       );
        }
        destroy(this,(slot_type *)((ulong)uVar3 * 0x28 + lVar7));
        uVar5 = uVar5 - 1;
      }
      lVar7 = lVar7 + 0x280;
      pauVar2 = pauVar4 + 1;
      if ((uVar5 != 0) && ((*pauVar4)[0xf] == -1)) {
        __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7a5,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                     );
      }
    }
    if (uVar6 < (this->settings_).
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ >> 1) {
      __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x7aa,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                   );
    }
  }
  return;
}

Assistant:

inline void destroy_slots() {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    if (PolicyTraits::template destroy_is_trivial<Alloc>()) return;
    IterateOverFullSlots(
        common(), slot_array(),
        [&](const ctrl_t*, slot_type* slot)
            ABSL_ATTRIBUTE_ALWAYS_INLINE { this->destroy(slot); });
  }